

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  ZSTD_cwksp *ws;
  U32 *pUVar1;
  void *__dest;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  size_t err_code;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  U32 *pUVar8;
  ZSTD_CCtx_params params;
  
  auVar2 = vpaddd_avx(cParams._0_16_,_DAT_001a1300);
  auVar3 = vpminud_avx(auVar2,_DAT_001a1310);
  auVar2 = vpcmpeqd_avx(auVar2,auVar3);
  if (((((((auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
          (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar2[0xf] < '\0')
       || (cParams.minMatch - 8 < 0xfffffffb)) || (0x20000 < cParams.targetLength)) ||
     (cParams.strategy + ~ZSTD_btultra2 < 0xfffffff7)) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3742,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters)"
                 );
  }
  uVar4 = cParams._8_8_;
  (cdict->matchState).cParams.searchLog = (int)cParams._12_8_;
  (cdict->matchState).cParams.minMatch = (int)((ulong)cParams._12_8_ >> 0x20);
  (cdict->matchState).cParams.targetLength = (int)cParams._20_8_;
  (cdict->matchState).cParams.strategy = (int)((ulong)cParams._20_8_ >> 0x20);
  (cdict->matchState).cParams.windowLog = cParams.windowLog;
  (cdict->matchState).cParams.chainLog = cParams.chainLog;
  (cdict->matchState).cParams.hashLog = (int)uVar4;
  (cdict->matchState).cParams.searchLog = (int)((ulong)uVar4 >> 0x20);
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictContent = dictBuffer;
LAB_0014f490:
    cdict->dictContentSize = dictSize;
    pUVar8 = (U32 *)(cdict->workspace).objectEnd;
    if (((ulong)pUVar8 & 7) != 0) {
LAB_0014f62a:
      __assert_fail("((size_t)alloc & (sizeof(void*)-1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d30,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
    }
    ws = &cdict->workspace;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (((cdict->workspace).phase == ZSTD_cwksp_alloc_objects) &&
       (pUVar1 = pUVar8 + 0x600, pUVar1 <= (cdict->workspace).workspaceEnd)) {
      (cdict->workspace).objectEnd = pUVar1;
      (cdict->workspace).tableEnd = pUVar1;
      (cdict->workspace).tableValidEnd = pUVar1;
    }
    else {
      (cdict->workspace).allocFailed = 1;
      pUVar8 = (U32 *)0x0;
    }
    cdict->entropyWorkspace = pUVar8;
    lVar7 = 0;
    do {
      *(undefined4 *)((long)(cdict->cBlockState).rep + lVar7) =
           *(undefined4 *)((long)repStartValue + lVar7);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0xc);
    (cdict->cBlockState).entropy.huf.repeatMode = HUF_repeat_none;
    (cdict->cBlockState).entropy.fse.offcode_repeatMode = FSE_repeat_none;
    (cdict->cBlockState).entropy.fse.matchlength_repeatMode = FSE_repeat_none;
    (cdict->cBlockState).entropy.fse.litlength_repeatMode = FSE_repeat_none;
    sVar6 = ZSTD_reset_matchState
                      (&cdict->matchState,ws,&cParams,ZSTDcrp_makeClean,ZSTDirp_reset,
                       ZSTD_resetTarget_CDict);
    if (sVar6 < 0xffffffffffffff89) {
      params.ldmParams._0_16_ = ZEXT816(0) << 0x40;
      params.customMem.customFree = (ZSTD_freeFunction)0x0;
      params.customMem.opaque = (void *)0x0;
      params._64_32_ = ZEXT1632((undefined1  [16])params.ldmParams._0_16_);
      params.ldmParams.hashRateLog = 0;
      params.ldmParams.windowLog = 0;
      params.customMem.customAlloc = (ZSTD_allocFunction)0x0;
      params.fParams = params.ldmParams._0_12_;
      params.compressionLevel = 3;
      params._36_28_ = ZEXT1228(params._36_12_);
      params.fParams.contentSizeFlag = 1;
      auVar2._12_4_ = cParams.searchLog;
      auVar2._8_4_ = cParams.hashLog;
      params.cParams.minMatch = cParams.minMatch;
      params.cParams.searchLog = cParams.searchLog;
      params.cParams.strategy = cParams.strategy;
      params.cParams.targetLength = cParams.targetLength;
      auVar2._0_4_ = cParams.windowLog;
      auVar2._4_4_ = cParams.chainLog;
      params._0_16_ = auVar2 << 0x20;
      sVar6 = ZSTD_compress_insertDictionary
                        (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,ws,&params,
                         cdict->dictContent,cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                         cdict->entropyWorkspace);
      if (sVar6 < 0xffffffffffffff89) {
        if (sVar6 >> 0x20 != 0) {
          __assert_fail("dictID <= (size_t)(U32)-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3767,
                        "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters)"
                       );
        }
        cdict->dictID = (U32)sVar6;
        sVar6 = 0;
      }
    }
  }
  else {
    __dest = (cdict->workspace).objectEnd;
    if (((ulong)__dest & 7) != 0) goto LAB_0014f62a;
    ZSTD_cwksp_assert_internal_consistency(&cdict->workspace);
    if (((cdict->workspace).phase == ZSTD_cwksp_alloc_objects) &&
       (pvVar5 = (void *)((dictSize + 7 & 0xfffffffffffffff8) + (long)__dest),
       pvVar5 <= (cdict->workspace).workspaceEnd)) {
      (cdict->workspace).objectEnd = pvVar5;
      (cdict->workspace).tableEnd = pvVar5;
      (cdict->workspace).tableValidEnd = pvVar5;
      if (__dest != (void *)0x0) {
        cdict->dictContent = __dest;
        memcpy(__dest,dictBuffer,dictSize);
        goto LAB_0014f490;
      }
    }
    else {
      (cdict->workspace).allocFailed = 1;
    }
    sVar6 = 0xffffffffffffffc0;
  }
  return sVar6;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->matchState.cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation);
        cdict->dictContent = internalBuffer;
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &cParams,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict));
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID);
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}